

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_explain.c
# Opt level: O0

void version_explain(char *v,int flags)

{
  size_t sVar1;
  ulong local_58;
  size_t i;
  size_t len;
  component_t components [2];
  char *pcStack_10;
  int flags_local;
  char *v_local;
  
  components[1].end._4_4_ = flags;
  pcStack_10 = v;
  fprintf(_stderr,"%3s %s\n","M/O","Data");
  while (*pcStack_10 != '\0') {
    sVar1 = get_next_version_component
                      (&stack0xfffffffffffffff0,(component_t *)&len,components[1].end._4_4_);
    for (local_58 = 0; local_58 < sVar1; local_58 = local_58 + 1) {
      fprintf(_stderr,"%3d \"%.*s\"\n",(ulong)*(uint *)&components[local_58 - 1].end,
              (ulong)(uint)((int)components[local_58].start -
                           (int)*(undefined8 *)(components + local_58)),
              *(undefined8 *)(components + local_58));
    }
  }
  return;
}

Assistant:

void version_explain(const char* v, int flags) {
    component_t components[2];

    fprintf(stderr, "%3s %s\n", "M/O", "Data");
    while (*v != '\0') {
        size_t len = get_next_version_component(&v, components, flags);

        for (size_t i = 0; i < len; i++) {
            fprintf(stderr, "%3d \"%.*s\"\n", components[i].metaorder, (int)(components[i].end - components[i].start), components[i].start);
        }
    }
}